

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O0

void __thiscall
wasm::ModuleRunnerBase<wasm::ModuleRunner>::initializeTableContents
          (ModuleRunnerBase<wasm::ModuleRunner> *this)

{
  undefined1 auVar1 [8];
  ExternalInterface *pEVar2;
  size_t sVar3;
  bool bVar4;
  vector<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
  *this_00;
  ulong uVar5;
  pointer pTVar6;
  address64_t aVar7;
  address64_t aVar8;
  Address local_80;
  Address i;
  undefined1 local_70 [8];
  Literal null;
  undefined1 local_48 [8];
  TableInterfaceInfo info;
  unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_> *table;
  iterator __end2;
  iterator __begin2;
  vector<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
  *__range2;
  ModuleRunnerBase<wasm::ModuleRunner> *this_local;
  
  this_00 = &this->wasm->tables;
  __end2 = std::
           vector<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
           ::begin(this_00);
  table = (unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_> *)
          std::
          vector<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
          ::end(this_00);
  while (bVar4 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_*,_std::vector<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>_>
                                     *)&table), bVar4) {
    info.name.super_IString.str._M_str =
         (char *)__gnu_cxx::
                 __normal_iterator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_*,_std::vector<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>_>
                 ::operator*(&__end2);
    std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>::operator->
              ((unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_> *)
               info.name.super_IString.str._M_str);
    uVar5 = ::wasm::Type::isNullable();
    if ((uVar5 & 1) != 0) {
      pTVar6 = std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>::operator->
                         ((unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_> *)
                          info.name.super_IString.str._M_str);
      null.type.id = (pTVar6->super_Importable).super_Named.name.super_IString.str._M_len;
      getTableInterfaceInfo
                ((TableInterfaceInfo *)local_48,this,
                 (Name)(pTVar6->super_Importable).super_Named.name.super_IString.str);
      std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>::operator->
                ((unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_> *)
                 info.name.super_IString.str._M_str);
      i.addr = ::wasm::Type::getHeapType();
      wasm::Literal::makeNull((Literal *)local_70,(HeapType)i.addr);
      Address::Address(&local_80,0);
      while( true ) {
        aVar7 = Address::operator_cast_to_unsigned_long(&local_80);
        pTVar6 = std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>::operator->
                           ((unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_> *)
                            info.name.super_IString.str._M_str);
        aVar8 = Address::operator_cast_to_unsigned_long(&pTVar6->initial);
        sVar3 = info.name.super_IString.str._M_len;
        pEVar2 = info.interface;
        auVar1 = local_48;
        if (aVar8 <= aVar7) break;
        aVar7 = Address::operator_cast_to_unsigned_long(&local_80);
        (*(*(_func_int ***)auVar1)[0x1c])(auVar1,pEVar2,sVar3,aVar7 & 0xffffffff,local_70);
        Address::operator++(&local_80,0);
      }
      ::wasm::Literal::~Literal((Literal *)local_70);
    }
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_*,_std::vector<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>_>
    ::operator++(&__end2);
  }
  ModuleUtils::
  iterActiveElementSegments<wasm::ModuleRunnerBase<wasm::ModuleRunner>::initializeTableContents()::_lambda(wasm::ElementSegment*)_1_>
            (this->wasm,(anon_class_8_1_8991fb9c)this);
  return;
}

Assistant:

void initializeTableContents() {
    for (auto& table : wasm.tables) {
      if (table->type.isNullable()) {
        // Initial with nulls in a nullable table.
        auto info = getTableInterfaceInfo(table->name);
        auto null = Literal::makeNull(table->type.getHeapType());
        for (Address i = 0; i < table->initial; i++) {
          info.interface->tableStore(info.name, i, null);
        }
      }
    }

    ModuleUtils::iterActiveElementSegments(wasm, [&](ElementSegment* segment) {
      Address offset =
        (uint32_t)self()->visit(segment->offset).getSingleValue().geti32();

      Table* table = wasm.getTable(segment->table);
      ExternalInterface* extInterface = externalInterface;
      Name tableName = segment->table;
      if (table->imported()) {
        auto inst = linkedInstances.at(table->module);
        extInterface = inst->externalInterface;
        tableName = inst->wasm.getExport(table->base)->value;
      }

      for (Index i = 0; i < segment->data.size(); ++i) {
        Flow ret = self()->visit(segment->data[i]);
        extInterface->tableStore(tableName, offset + i, ret.getSingleValue());
      }
    });
  }